

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_funcs.c
# Opt level: O2

ktx_error_code_e ktxLoadOpenGL(PFNGLGETPROCADDRESS pfnGLGetProcAddress)

{
  ktx_error_code_e kVar1;
  char *pcVar2;
  
  kVar1 = KTX_SUCCESS;
  if (openGLLoaded == '\0') {
    if (pfnGLGetProcAddress == (PFNGLGETPROCADDRESS)0x0) {
      kVar1 = ktxLoadOpenGLLibrary();
      if (kVar1 != KTX_SUCCESS) {
        return kVar1;
      }
      pfnGLGetProcAddress = defaultGLGetProcAddress;
    }
    gl.glBindTexture = (PFNGLBINDTEXTUREPROC)(*pfnGLGetProcAddress)("glBindTexture");
    if (gl.glBindTexture == (PFNGLBINDTEXTUREPROC)0x0) {
      pcVar2 = "glBindTexture";
    }
    else {
      gl.glCompressedTexImage1D =
           (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*pfnGLGetProcAddress)("glCompressedTexImage1D");
      gl.glCompressedTexImage2D =
           (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*pfnGLGetProcAddress)("glCompressedTexImage2D");
      if (gl.glCompressedTexImage2D == (PFNGLCOMPRESSEDTEXIMAGE2DPROC)0x0) {
        pcVar2 = "glCompressedTexImage2D";
      }
      else {
        gl.glCompressedTexImage3D =
             (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*pfnGLGetProcAddress)("glCompressedTexImage3D");
        gl.glCompressedTexSubImage1D =
             (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*pfnGLGetProcAddress)("glCompressedTexSubImage1D");
        gl.glCompressedTexSubImage2D =
             (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*pfnGLGetProcAddress)("glCompressedTexSubImage2D");
        if (gl.glCompressedTexSubImage2D == (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)0x0) {
          pcVar2 = "glCompressedTexSubImage2D";
        }
        else {
          gl.glCompressedTexSubImage3D =
               (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*pfnGLGetProcAddress)("glCompressedTexSubImage3D")
          ;
          gl.glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*pfnGLGetProcAddress)("glDeleteTextures");
          if (gl.glDeleteTextures == (PFNGLDELETETEXTURESPROC)0x0) {
            pcVar2 = "glDeleteTextures";
          }
          else {
            gl.glGenerateMipmap =
                 (PFNGLGENERATEMIPMAPPROC)(*pfnGLGetProcAddress)("glGenerateMipmap");
            gl.glGenTextures = (PFNGLGENTEXTURESPROC)(*pfnGLGetProcAddress)("glGenTextures");
            if (gl.glGenTextures == (PFNGLGENTEXTURESPROC)0x0) {
              pcVar2 = "glGenTextures";
            }
            else {
              gl.glGetError = (PFNGLGETERRORPROC)(*pfnGLGetProcAddress)("glGetError");
              if (gl.glGetError == (PFNGLGETERRORPROC)0x0) {
                pcVar2 = "glGetError";
              }
              else {
                gl.glGetIntegerv = (PFNGLGETINTEGERVPROC)(*pfnGLGetProcAddress)("glGetIntegerv");
                if (gl.glGetIntegerv == (PFNGLGETINTEGERVPROC)0x0) {
                  pcVar2 = "glGetIntegerv";
                }
                else {
                  gl.glGetString = (PFNGLGETSTRINGPROC)(*pfnGLGetProcAddress)("glGetString");
                  if (gl.glGetString == (PFNGLGETSTRINGPROC)0x0) {
                    pcVar2 = "glGetString";
                  }
                  else {
                    gl.glGetStringi = (PFNGLGETSTRINGIPROC)(*pfnGLGetProcAddress)("glGetStringi");
                    gl.glPixelStorei = (PFNGLPIXELSTOREIPROC)(*pfnGLGetProcAddress)("glPixelStorei")
                    ;
                    if (gl.glPixelStorei == (PFNGLPIXELSTOREIPROC)0x0) {
                      pcVar2 = "glPixelStorei";
                    }
                    else {
                      gl.glTexImage1D = (PFNGLTEXIMAGE1DPROC)(*pfnGLGetProcAddress)("glTexImage1D");
                      gl.glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*pfnGLGetProcAddress)("glTexImage2D");
                      if (gl.glTexImage2D == (PFNGLTEXIMAGE2DPROC)0x0) {
                        pcVar2 = "glTexImage2D";
                      }
                      else {
                        gl.glTexImage3D =
                             (PFNGLTEXIMAGE3DPROC)(*pfnGLGetProcAddress)("glTexImage3D");
                        gl.glTexParameteri =
                             (PFNGLTEXPARAMETERIPROC)(*pfnGLGetProcAddress)("glTexParameteri");
                        if (gl.glTexParameteri == (PFNGLTEXPARAMETERIPROC)0x0) {
                          pcVar2 = "glTexParameteri";
                        }
                        else {
                          gl.glTexParameteriv =
                               (PFNGLTEXPARAMETERIVPROC)(*pfnGLGetProcAddress)("glTexParameteriv");
                          if (gl.glTexParameteriv == (PFNGLTEXPARAMETERIVPROC)0x0) {
                            pcVar2 = "glTexParameteriv";
                          }
                          else {
                            gl.glTexStorage1D =
                                 (PFNGLTEXSTORAGE1DPROC)(*pfnGLGetProcAddress)("glTexStorage1D");
                            gl.glTexStorage2D =
                                 (PFNGLTEXSTORAGE2DPROC)(*pfnGLGetProcAddress)("glTexStorage2D");
                            gl.glTexStorage3D =
                                 (PFNGLTEXSTORAGE3DPROC)(*pfnGLGetProcAddress)("glTexStorage3D");
                            gl.glTexSubImage1D =
                                 (PFNGLTEXSUBIMAGE1DPROC)(*pfnGLGetProcAddress)("glTexSubImage1D");
                            gl.glTexSubImage2D =
                                 (PFNGLTEXSUBIMAGE2DPROC)(*pfnGLGetProcAddress)("glTexSubImage2D");
                            if (gl.glTexSubImage2D != (PFNGLTEXSUBIMAGE2DPROC)0x0) {
                              gl.glTexSubImage3D =
                                   (PFNGLTEXSUBIMAGE3DPROC)(*pfnGLGetProcAddress)("glTexSubImage3D")
                              ;
                              openGLLoaded = 1;
                              return KTX_SUCCESS;
                            }
                            pcVar2 = "glTexSubImage2D";
                            gl.glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fprintf(_stderr,"Could not load OpenGL command: %s!\n",pcVar2);
    kVar1 = KTX_NOT_FOUND;
  }
  return kVar1;
}

Assistant:

ktx_error_code_e
ktxLoadOpenGL(PFNGLGETPROCADDRESS pfnGLGetProcAddress)
{
    if (openGLLoaded)
        return KTX_SUCCESS;

    if (!pfnGLGetProcAddress) {
        ktx_error_code_e result = ktxLoadOpenGLLibrary();
        if (result != KTX_SUCCESS) {
            return result;
        }
        pfnGLGetProcAddress = defaultGLGetProcAddress;
    }

    // Load function pointers

#include "gl_funclist.inl"

    openGLLoaded = true;
    return KTX_SUCCESS;
}